

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_load.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalLoad::GetData
          (PhysicalLoad *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  string *url;
  ClientContext *pCVar1;
  pointer pLVar2;
  type pLVar3;
  undefined8 *puVar4;
  InternalException *this_00;
  _Alloc_hider _Var5;
  unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *this_01;
  string repository_url;
  ExtensionRepository repository;
  ExtensionInstallInfo *local_d0;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78 [2];
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  undefined1 local_58 [16];
  string local_48 [8];
  undefined2 local_40;
  bool local_3e;
  char local_38 [16];
  
  this_01 = &this->info;
  pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     (this_01);
  if ((pLVar2->load_type == INSTALL) ||
     (pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                         (this_01), pLVar2->load_type == FORCE_INSTALL)) {
    pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       (this_01);
    if ((pLVar2->repository)._M_string_length == 0) {
      local_68 = (undefined1  [8])0x0;
      local_58._0_8_ = 0;
      local_58[8] = '\0';
      local_40._0_1_ = false;
      local_40._1_1_ = false;
      local_3e = false;
      local_60._M_p = local_58 + 8;
      pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                         (this_01);
      local_40._0_1_ = pLVar2->load_type == FORCE_INSTALL;
      local_3e = true;
      unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->(this_01)
      ;
      ::std::__cxx11::string::_M_assign((string *)&local_60);
      pCVar1 = context->client;
      pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                         (this_01);
      ExtensionHelper::InstallExtension
                ((ExtensionHelper *)&local_d0,pCVar1,&pLVar2->filename,
                 (ExtensionInstallOptions *)local_68);
      if (local_d0 != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&local_d0,local_d0);
      }
      local_d0 = (ExtensionInstallInfo *)0x0;
      _Var5._M_p = local_60._M_p;
      if (local_60._M_p == local_58 + 8) {
        return FINISHED;
      }
    }
    else {
      pCVar1 = context->client;
      pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator*
                         (this_01);
      ExtensionRepository::ExtensionRepository((ExtensionRepository *)local_68);
      if ((pLVar3->repository)._M_string_length != 0) {
        url = &pLVar3->repository;
        if (pLVar3->repo_is_alias == true) {
          ExtensionRepository::TryGetRepositoryUrl((string *)&local_88,url);
          if (local_88._8_8_ == 0) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_c8 = (undefined1  [8])local_b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"The repository alias failed to resolve","");
            InternalException::InternalException(this_00,(string *)local_c8);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ExtensionRepository::ExtensionRepository
                    ((ExtensionRepository *)local_c8,url,(string *)&local_88);
          ::std::__cxx11::string::operator=((string *)local_68,(string *)local_c8);
          ::std::__cxx11::string::operator=(local_48,(string *)local_a8._M_local_buf);
          if ((char *)local_a8._0_8_ != local_98) {
            operator_delete((void *)local_a8._0_8_);
          }
          if (local_c8 != (undefined1  [8])local_b8) {
            operator_delete((void *)local_c8);
          }
          puVar4 = local_78;
        }
        else {
          ExtensionRepository::GetRepositoryByUrl((ExtensionRepository *)local_c8,url);
          ::std::__cxx11::string::operator=((string *)local_68,(string *)local_c8);
          ::std::__cxx11::string::operator=(local_48,(string *)local_a8._M_local_buf);
          if ((char *)local_a8._0_8_ != local_98) {
            operator_delete((void *)local_a8._0_8_);
          }
          puVar4 = (undefined8 *)local_b8;
        }
        if ((undefined8 *)puVar4[-2] != puVar4) {
          operator_delete((undefined8 *)puVar4[-2]);
        }
      }
      local_c8 = (undefined1  [8])0x0;
      local_b8._0_8_ = 0;
      local_b8[8] = '\0';
      local_a8._M_local_buf[9] = '\0';
      local_a8._M_local_buf[8] = pLVar3->load_type == FORCE_INSTALL;
      local_a8._M_local_buf[10] = '\x01';
      local_c0._M_p = local_b8 + 8;
      ::std::__cxx11::string::_M_assign((string *)&local_c0);
      local_c8 = (undefined1  [8])local_68;
      ExtensionHelper::InstallExtension
                ((ExtensionHelper *)local_88._M_local_buf,pCVar1,&pLVar3->filename,
                 (ExtensionInstallOptions *)local_c8);
      if ((ExtensionInstallInfo *)local_88._M_allocated_capacity != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)local_88._M_local_buf,
                   (ExtensionInstallInfo *)local_88._M_allocated_capacity);
      }
      local_88._M_allocated_capacity = 0;
      if (local_c0._M_p != local_b8 + 8) {
        operator_delete(local_c0._M_p);
      }
      if (local_48 != (string  [8])local_38) {
        operator_delete((void *)local_48);
      }
      _Var5._M_p = (pointer)local_68;
      if (local_68 == (undefined1  [8])local_58) {
        return FINISHED;
      }
    }
    operator_delete(_Var5._M_p);
  }
  else {
    pCVar1 = context->client;
    pLVar2 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       (this_01);
    ExtensionHelper::LoadExternalExtension(pCVar1,&pLVar2->filename);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalLoad::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	if (info->load_type == LoadType::INSTALL || info->load_type == LoadType::FORCE_INSTALL) {
		if (info->repository.empty()) {
			ExtensionInstallOptions options;
			options.force_install = info->load_type == LoadType::FORCE_INSTALL;
			options.throw_on_origin_mismatch = true;
			options.version = info->version;
			ExtensionHelper::InstallExtension(context.client, info->filename, options);
		} else {
			InstallFromRepository(context.client, *info);
		}

	} else {
		ExtensionHelper::LoadExternalExtension(context.client, info->filename);
	}

	return SourceResultType::FINISHED;
}